

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

Au_Ntk_t * Au_NtkParseCBlif(char *pFileName)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  char *__ptr;
  Vec_Int_t *p;
  Au_Man_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  char *pcVar5;
  char *pcVar6;
  Au_Ntk_t *pAVar7;
  Au_Obj_t *pAVar8;
  uint uVar9;
  long lVar10;
  int i;
  Au_Obj_t *pAVar11;
  bool bVar12;
  Au_Ntk_t *local_50;
  int local_40;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
    return (Au_Ntk_t *)0x0;
  }
  __ptr = Extra_FileRead((FILE *)__stream);
  fclose(__stream);
  p = Vec_IntAlloc(1000);
  lVar10 = 0;
  Vec_IntPush(p,0);
  do {
    if (__ptr[lVar10] == '\n') {
      __ptr[lVar10] = '\0';
      Vec_IntPush(p,(int)lVar10 + 1);
    }
    else if (__ptr[lVar10] == '\0') break;
    lVar10 = lVar10 + 1;
  } while( true );
  p_00 = Au_ManAlloc(pFileName);
  p_01 = Vec_IntAlloc(1000);
  p_02 = Vec_IntAlloc(1000);
  uVar9 = 0;
  local_50 = (Au_Ntk_t *)0x0;
  do {
    if (p->nSize <= (int)uVar9) {
      Vec_IntFree(p_02);
      Vec_IntFree(p_01);
      Vec_IntFree(p);
      iVar1 = 1;
      do {
        if ((p_00->vNtks).nSize <= iVar1) {
          free(__ptr);
          pAVar7 = Au_ManNtkRoot(p_00);
          Au_ManReorderModels(p_00,pAVar7);
          return pAVar7;
        }
        pAVar7 = (Au_Ntk_t *)Vec_PtrEntry(&p_00->vNtks,iVar1);
        for (iVar2 = 0; iVar2 < (pAVar7->vObjs).nSize; iVar2 = iVar2 + 1) {
          pAVar11 = Au_NtkObjI(pAVar7,iVar2);
          if ((*(ulong *)pAVar11 & 0x700000000) == 0x600000000) {
            uVar9 = Au_ManFindNtk(p_00,__ptr + ((uint)*(ulong *)pAVar11 & 0x3fffffff));
            *(ulong *)pAVar11 = *(ulong *)pAVar11 & 0xffffffffc0000000 | (ulong)(uVar9 & 0x3fffffff)
            ;
            if ((uVar9 & 0x3fffffff) == 0) {
              __assert_fail("pBox->Func > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                            ,0x44a,"Au_Ntk_t *Au_NtkParseCBlif(char *)");
            }
            for (i = 0; iVar4 = Au_BoxFanoutNum(pAVar11), i < iVar4; i = i + 1) {
              pAVar8 = Au_BoxFanout(pAVar11,i);
              *(ulong *)pAVar8 =
                   *(ulong *)pAVar8 & 0xffffffffc0000000 |
                   (ulong)((uint)*(undefined8 *)pAVar11 & 0x3fffffff);
            }
          }
        }
        iVar1 = iVar1 + 1;
      } while( true );
    }
    iVar1 = Vec_IntEntry(p,uVar9);
    pcVar5 = strtok(__ptr + iVar1," \t\r");
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '#')) {
      if (*pcVar5 == '.') {
        p_02->nSize = 0;
        iVar2 = strcmp(pcVar5,".and");
        if (iVar2 == 0) {
          iVar1 = 2;
          while (bVar12 = iVar1 != 0, iVar1 = iVar1 + -1, bVar12) {
            pcVar5 = strtok((char *)0x0," \t\r");
            iVar2 = atoi(pcVar5);
            iVar2 = Au_NtkRemapNum(p_01,iVar2);
            Vec_IntPush(p_02,iVar2);
          }
          iVar1 = 1;
        }
        else {
          iVar2 = strcmp(pcVar5,".xor");
          if (iVar2 == 0) {
            iVar1 = 2;
            while (bVar12 = iVar1 != 0, iVar1 = iVar1 + -1, bVar12) {
              pcVar5 = strtok((char *)0x0," \t\r");
              iVar2 = atoi(pcVar5);
              iVar2 = Au_NtkRemapNum(p_01,iVar2);
              Vec_IntPush(p_02,iVar2);
            }
            iVar1 = 2;
          }
          else {
            iVar2 = strcmp(pcVar5,".mux");
            if (iVar2 != 0) {
              iVar2 = strcmp(pcVar5,".subckt");
              if (iVar2 == 0) {
                pcVar5 = strtok((char *)0x0," \t\r");
                local_40 = (int)__ptr;
                pcVar6 = strtok((char *)0x0," \t\r");
                iVar1 = atoi(pcVar6);
                pcVar6 = strtok((char *)0x0," \t\r");
                iVar2 = atoi(pcVar6);
                while ((pcVar6 = strtok((char *)0x0," \t\r"), pcVar6 != (char *)0x0 &&
                       (*pcVar6 != '#'))) {
                  Au_NtkParseCBlifNum(p_02,pcVar6,p_01);
                }
                if (p_02->nSize != iVar1) {
                  __assert_fail("Vec_IntSize(vFanins) == nInputs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                                ,0x41b,"Au_Ntk_t *Au_NtkParseCBlif(char *)");
                }
                uVar3 = Au_NtkCreateBox(local_50,p_02,iVar2,(int)pcVar5 - local_40);
                pAVar11 = (Au_Obj_t *)
                          ((ulong)((uVar3 & 0xfff) << 4) +
                          (long)(local_50->vPages).pArray[(int)uVar3 >> 0xc]);
                for (iVar1 = 0; iVar2 = Au_BoxFanoutNum(pAVar11), iVar1 < iVar2; iVar1 = iVar1 + 1)
                {
                  iVar2 = Au_BoxFanoutId(pAVar11,iVar1);
                  Vec_IntPush(p_01,iVar2);
                }
              }
              else {
                iVar2 = strcmp(pcVar5,".model");
                if (iVar2 == 0) {
                  pcVar5 = strtok((char *)0x0," \t\r");
                  local_50 = Au_NtkAlloc(p_00,pcVar5);
                  iVar1 = Au_NtkCreateConst0(local_50);
                  p_01->nSize = 0;
                  Vec_IntPush(p_01,iVar1);
                }
                else {
                  iVar2 = strcmp(pcVar5,".inputs");
                  if (iVar2 == 0) {
                    pcVar5 = strtok((char *)0x0," \t\r");
                    iVar1 = atoi(pcVar5);
                    if (iVar1 < 1) {
                      iVar1 = 0;
                    }
                    while (iVar1 != 0) {
                      iVar2 = Au_NtkCreatePi(local_50);
                      Vec_IntPush(p_01,iVar2);
                      iVar1 = iVar1 + -1;
                    }
                  }
                  else {
                    iVar2 = strcmp(pcVar5,".outputs");
                    if (iVar2 == 0) {
                      pcVar5 = strtok((char *)0x0," \t\r");
                      iVar1 = atoi(pcVar5);
                      while ((pcVar5 = strtok((char *)0x0," \t\r"), pcVar5 != (char *)0x0 &&
                             (*pcVar5 != '#'))) {
                        Au_NtkParseCBlifNum(p_02,pcVar5,p_01);
                      }
                      if (p_02->nSize != iVar1) {
                        __assert_fail("Vec_IntSize(vFanins) == nOutputs",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                                      ,0x43b,"Au_Ntk_t *Au_NtkParseCBlif(char *)");
                      }
                      for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
                        iVar1 = Vec_IntEntry(p_02,iVar2);
                        Au_NtkCreatePo(local_50,iVar1);
                        iVar1 = p_02->nSize;
                      }
                    }
                    else {
                      iVar2 = strcmp(pcVar5,".end");
                      if (iVar2 != 0) {
                        pcVar5 = "Unknown directive in line %d: \"%s\".\n";
                        goto LAB_006b949a;
                      }
                    }
                  }
                }
              }
              goto LAB_006b94aa;
            }
            iVar1 = 3;
            while (bVar12 = iVar1 != 0, iVar1 = iVar1 + -1, bVar12) {
              pcVar5 = strtok((char *)0x0," \t\r");
              iVar2 = atoi(pcVar5);
              iVar2 = Au_NtkRemapNum(p_01,iVar2);
              Vec_IntPush(p_02,iVar2);
            }
            iVar1 = 3;
          }
        }
        iVar1 = Au_NtkCreateNode(local_50,p_02,iVar1);
        Vec_IntPush(p_01,iVar1);
      }
      else {
        pcVar5 = "Cannot read directive in line %d: \"%s\".\n";
LAB_006b949a:
        printf(pcVar5,(ulong)uVar9,__ptr + iVar1);
      }
    }
LAB_006b94aa:
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

Au_Ntk_t * Au_NtkParseCBlif( char * pFileName )
{
    FILE * pFile;
    Au_Man_t * pMan;
    Au_Ntk_t * pRoot = NULL;
    Au_Obj_t * pBox, * pFan;
    char * pBuffer, * pCur;
    Vec_Int_t * vLines, * vNum2Obj, * vFanins;
    int i, k, j, Id, nInputs, nOutputs;
    int Line, Num, Func;
    // read the file
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    pBuffer = Extra_FileRead( pFile );
    fclose( pFile );
    // split into lines
    vLines = Vec_IntAlloc( 1000 );
    Vec_IntPush( vLines, 0 );
    for ( pCur = pBuffer; *pCur; pCur++ )
        if ( *pCur == '\n' )
        {
            *pCur = 0;
            Vec_IntPush( vLines, pCur - pBuffer + 1 );
        }
    // start the manager
    pMan = Au_ManAlloc( pFileName );
    // parse the lines
    vNum2Obj = Vec_IntAlloc( 1000 );
    vFanins = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vLines, Line, i )
    {
        pCur = strtok( pBuffer + Line, " \t\r" );
        if ( pCur == NULL || *pCur == '#' )
            continue;
        if ( *pCur != '.' )
        {
            printf( "Cannot read directive in line %d: \"%s\".\n", i, pBuffer + Line );
            continue;
        }
        Vec_IntClear( vFanins );
        if ( !strcmp(pCur, ".and") )
        {
            for ( k = 0; k < 2; k++ )
            {
                pCur = strtok( NULL, " \t\r" );
                Num  = atoi( pCur );
                Vec_IntPush( vFanins, Au_NtkRemapNum(vNum2Obj, Num) );
            }
            Id = Au_NtkCreateNode( pRoot, vFanins, 1 );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".xor") )
        {
            for ( k = 0; k < 2; k++ )
            {
                pCur = strtok( NULL, " \t\r" );
                Num  = atoi( pCur );
                Vec_IntPush( vFanins, Au_NtkRemapNum(vNum2Obj, Num) );
            }
            Id = Au_NtkCreateNode( pRoot, vFanins, 2 );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".mux") )
        {
            for ( k = 0; k < 3; k++ )
            {
                pCur = strtok( NULL, " \t\r" );
                Num  = atoi( pCur );
                Vec_IntPush( vFanins, Au_NtkRemapNum(vNum2Obj, Num) );
            }
            Id = Au_NtkCreateNode( pRoot, vFanins, 3 );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".subckt") )
        {
            pCur = strtok( NULL, " \t\r" );
            Func = pCur - pBuffer;
            pCur = strtok( NULL, " \t\r" );
            nInputs = atoi( pCur );
            pCur = strtok( NULL, " \t\r" );
            nOutputs = atoi( pCur );
            while ( 1 )
            {
                pCur = strtok( NULL, " \t\r" );
                if ( pCur == NULL || *pCur == '#' )
                    break;
                Au_NtkParseCBlifNum( vFanins, pCur, vNum2Obj );
            }
            assert( Vec_IntSize(vFanins) == nInputs );
            Id = Au_NtkCreateBox( pRoot, vFanins, nOutputs, Func );
            pBox = Au_NtkObj( pRoot, Id );
            Au_BoxForEachFanoutId( pBox, Num, k )
                Vec_IntPush( vNum2Obj, Num );
        }
        else if ( !strcmp(pCur, ".model") )
        {
            pCur  = strtok( NULL, " \t\r" );
            pRoot = Au_NtkAlloc( pMan, pCur );
            Id    = Au_NtkCreateConst0( pRoot );
            Vec_IntClear( vNum2Obj );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".inputs") )
        {
            pCur = strtok( NULL, " \t\r" );
            Num  = atoi( pCur );
            for ( k = 0; k < Num; k++ )
                Vec_IntPush( vNum2Obj, Au_NtkCreatePi(pRoot) );
        }
        else if ( !strcmp(pCur, ".outputs") )
        {
            pCur = strtok( NULL, " \t\r" );
            nOutputs = atoi( pCur );
            while ( 1 )
            {
                pCur = strtok( NULL, " \t\r" );
                if ( pCur == NULL || *pCur == '#' )
                    break; 
                Au_NtkParseCBlifNum( vFanins, pCur, vNum2Obj );
            }
            assert( Vec_IntSize(vFanins) == nOutputs );
            Vec_IntForEachEntry( vFanins, Num, k )
                Au_NtkCreatePo( pRoot, Num );
        }
        else if ( strcmp(pCur, ".end") )
            printf( "Unknown directive in line %d: \"%s\".\n", i, pBuffer + Line );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vNum2Obj );
    Vec_IntFree( vLines );
    // set pointers to models
    Au_ManForEachNtk( pMan, pRoot, i )
        Au_NtkForEachBox( pRoot, pBox, k )
        {
            pBox->Func = Au_ManFindNtk( pMan, pBuffer + pBox->Func );
            assert( pBox->Func > 0 );
            Au_BoxForEachFanout( pBox, pFan, j )
                pFan->Func = pBox->Func;
        }
    ABC_FREE( pBuffer );
    // order models in topological order
    pRoot = Au_ManNtkRoot( pMan );
    Au_ManReorderModels( pMan, pRoot );
    return pRoot;
}